

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Result::~Result(Result *this)

{
  std::__cxx11::string::~string((string *)&this->body);
  std::__cxx11::string::~string((string *)&this->msg);
  return;
}

Assistant:

Result() = default;